

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O3

pair<unsigned_long,_duckdb::dtime_t> __thiscall
duckdb_skiplistlib::skip_list::
Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
::_Pool::Release(_Pool *this,
                Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
                *pNode)

{
  Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
  *pNVar1;
  pointer pNVar2;
  pair<unsigned_long,_duckdb::dtime_t> pVar3;
  
  pVar3 = pNode->_value;
  pNVar1 = this->cache;
  this->cache = pNode;
  if ((pNVar1 != (Node<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>
                  *)0x0) &&
     (pNVar2 = (pNVar1->_nodeRefs)._nodes.
               super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::dtime_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::dtime_t>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start, pNVar2 != (pointer)0x0)) {
    operator_delete(pNVar2);
  }
  operator_delete(pNVar1);
  return pVar3;
}

Assistant:

T Release(Node *pNode) {
			T result = pNode->value();
			std::swap(pNode, cache);
			delete pNode;
			return result;
		}